

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3BSPFileImporter.cpp
# Opt level: O2

void __thiscall
Assimp::Q3BSPFileImporter::InternReadFile
          (Q3BSPFileImporter *this,string *rFile,aiScene *scene,IOSystem *ioHandler)

{
  bool bVar1;
  Q3BSPModel *pModel;
  DeadlyImportError *this_00;
  Q3BSPFileImporter *this_01;
  string mapName;
  string archiveName;
  Q3BSPFileParser fileParser;
  ZipArchiveIOSystem Archive;
  
  ZipArchiveIOSystem::ZipArchiveIOSystem(&Archive,ioHandler,rFile,"r");
  bVar1 = ZipArchiveIOSystem::isOpen(&Archive);
  if (!bVar1) {
    this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::operator+(&archiveName,"Failed to open file ",rFile);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fileParser,
                   &archiveName,".");
    DeadlyImportError::DeadlyImportError(this_00,(string *)&fileParser);
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&archiveName,"",(allocator<char> *)&fileParser);
  this_01 = (Q3BSPFileImporter *)&mapName;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)this_01,"",(allocator<char> *)&fileParser);
  separateMapName(this_01,rFile,&archiveName,&mapName);
  if (mapName._M_string_length == 0) {
    bVar1 = findFirstMapInArchive(this_01,&Archive,&mapName);
    if (!bVar1) goto LAB_004c046e;
  }
  Q3BSPFileParser::Q3BSPFileParser(&fileParser,&mapName,&Archive);
  pModel = Q3BSPFileParser::getModel(&fileParser);
  if (pModel != (Q3BSPModel *)0x0) {
    CreateDataFromImport(this,pModel,scene,&Archive);
  }
  Q3BSPFileParser::~Q3BSPFileParser(&fileParser);
LAB_004c046e:
  std::__cxx11::string::~string((string *)&mapName);
  std::__cxx11::string::~string((string *)&archiveName);
  ZipArchiveIOSystem::~ZipArchiveIOSystem(&Archive);
  return;
}

Assistant:

void Q3BSPFileImporter::InternReadFile(const std::string &rFile, aiScene* scene, IOSystem* ioHandler) {
    ZipArchiveIOSystem Archive( ioHandler, rFile );
    if ( !Archive.isOpen() ) {
        throw DeadlyImportError( "Failed to open file " + rFile + "." );
    }

    std::string archiveName( "" ), mapName( "" );
    separateMapName( rFile, archiveName, mapName );

    if ( mapName.empty() ) {
        if ( !findFirstMapInArchive( Archive, mapName ) ) {
            return;
        }
    }

    Q3BSPFileParser fileParser( mapName, &Archive );
    Q3BSPModel *pBSPModel = fileParser.getModel();
    if ( nullptr != pBSPModel ) {
        CreateDataFromImport( pBSPModel, scene, &Archive );
    }
}